

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

optional<wasm::HeapType> wasm::HeapType::getLeastUpperBound(HeapType a,HeapType b)

{
  _Storage<wasm::HeapType,_true> _Var1;
  _Storage<wasm::HeapType,_true> _Var2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  uint uVar5;
  BasicHeapType b_00;
  BasicHeapType b_01;
  _Storage<wasm::HeapType,_true> _Var6;
  undefined8 unaff_R14;
  ulong uVar7;
  undefined7 uVar8;
  _Storage<wasm::HeapType,_true> _Var9;
  _Storage<wasm::HeapType,_true> _Var10;
  bool bVar11;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::HeapTypeInfo_*,_true,_false>,_bool>
  pVar12;
  optional<wasm::HeapType> oVar13;
  undefined1 local_98 [8];
  unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
  seen;
  _Storage<wasm::HeapType,_true> local_58;
  _Storage<wasm::HeapType,_true> local_50;
  HeapType a_local;
  HeapType b_local;
  HeapTypeInfo *infoA;
  HeapTypeInfo *infoB;
  
  uVar7 = CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
  if (a.id != b.id) {
    local_50 = (_Storage<wasm::HeapType,_true>)a.id;
    a_local = b;
    BVar3 = getBottom(&local_50._M_value);
    a.id._4_4_ = 0;
    a.id._0_4_ = BVar3;
    BVar4 = getBottom(&a_local);
    if (BVar3 == BVar4) {
      if (((0x7c < (ulong)local_50) ||
          (uVar5 = local_50._0_4_ & 0x7b, a = a_local, 4 < (uVar5 << 0x1d | uVar5 - 8 >> 3) - 10))
         && ((0x7c < a_local.id ||
             (uVar5 = (uint)a_local.id & 0x7b, a.id = (uintptr_t)local_50,
             4 < (uVar5 << 0x1d | uVar5 - 8 >> 3) - 10)))) {
        if (0x7c < (ulong)local_50 && 0x7c < a_local.id) {
          b_local.id = (uintptr_t)local_50._M_value.id;
          infoA = (HeapTypeInfo *)a_local.id;
          if (*(int *)((long)local_50 + 0x30) == *(int *)(a_local.id + 0x30)) {
            local_98 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
            seen._M_h._M_buckets = (__buckets_ptr)0x1;
            seen._M_h._M_bucket_count = 0;
            seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            seen._M_h._M_element_count._0_4_ = 0x3f800000;
            seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
            seen._M_h._M_rehash_policy._4_4_ = 0;
            seen._M_h._M_rehash_policy._M_next_resize = 0;
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      *)local_98,(value_type *)&b_local);
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      *)local_98,&infoA);
            _Var2 = (_Storage<wasm::HeapType,_true>)infoA;
            _Var9 = (_Storage<wasm::HeapType,_true>)b_local;
            do {
              _Var6 = _Var2;
              a.id = (((_Storage<wasm::HeapType,_true> *)((long)_Var9 + 8))->_M_value).id;
              _Var1 = *(_Storage<wasm::HeapType,_true> *)((long)_Var6 + 8);
              bVar11 = _Var1 == (_Storage<wasm::HeapType,_true>)0x0;
              uVar8 = (undefined7)(uVar7 >> 8);
              uVar7 = CONCAT71(uVar8,bVar11);
              seen._M_h._M_single_bucket = (__node_base_ptr)a.id;
              local_58 = _Var1;
              if ((_Storage<wasm::HeapType,_true>)a.id == (_Storage<wasm::HeapType,_true>)0x0 &&
                  bVar11) {
                b_local.id = (uintptr_t)_Var9;
                infoA = (HeapTypeInfo *)_Var6;
                BVar3 = anon_unknown_0::getBasicHeapSupertype(local_50._M_value.id);
                BVar4 = anon_unknown_0::getBasicHeapSupertype(a_local);
                oVar13 = anon_unknown_0::getBasicHeapTypeLUB
                                   ((anon_unknown_0 *)(ulong)BVar3,BVar4,b_01);
                a.id = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
                uVar7 = (ulong)oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._8_4_;
                goto LAB_00cc074e;
              }
              _Var10 = _Var9;
              if (((_Storage<wasm::HeapType,_true>)a.id != (_Storage<wasm::HeapType,_true>)0x0) &&
                 (pVar12 = std::
                           unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                           ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                     *)local_98,(value_type *)&seen._M_h._M_single_bucket),
                 _Var10 = (_Storage<wasm::HeapType,_true>)a.id,
                 ((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
                uVar7 = CONCAT71(uVar8,1);
                b_local.id = (uintptr_t)_Var9;
                infoA = (HeapTypeInfo *)_Var6;
                goto LAB_00cc074e;
              }
              _Var2 = _Var6;
              _Var9 = _Var10;
            } while ((bVar11) ||
                    (pVar12 = std::
                              unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                              ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                        *)local_98,(value_type *)&local_58), _Var2 = _Var1,
                    ((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0));
            uVar7 = CONCAT71(uVar8,1);
            a.id = (uintptr_t)_Var1;
            b_local.id = (uintptr_t)_Var10;
            infoA = (HeapTypeInfo *)_Var6;
LAB_00cc074e:
            std::
            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
            ::~unordered_set((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                              *)local_98);
            goto LAB_00cc075a;
          }
        }
        BVar3 = anon_unknown_0::getBasicHeapSupertype(local_50._M_value.id);
        BVar4 = anon_unknown_0::getBasicHeapSupertype(a_local);
        oVar13 = anon_unknown_0::getBasicHeapTypeLUB((anon_unknown_0 *)(ulong)BVar3,BVar4,b_00);
        a.id = oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
        uVar7 = (ulong)oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._8_4_;
      }
    }
    else {
      uVar7 = 0;
    }
  }
LAB_00cc075a:
  oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = uVar7 & 0xffffffff;
  oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id = (HeapType)(HeapType)a.id;
  return (optional<wasm::HeapType>)
         oVar13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> HeapType::getLeastUpperBound(HeapType a, HeapType b) {
  if (a == b) {
    return a;
  }
  if (a.getBottom() != b.getBottom()) {
    return {};
  }
  if (a.isBottom()) {
    return b;
  }
  if (b.isBottom()) {
    return a;
  }
  if (a.isBasic() || b.isBasic()) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  auto* infoA = getHeapTypeInfo(a);
  auto* infoB = getHeapTypeInfo(b);

  if (infoA->kind != infoB->kind) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  // Walk up the subtype tree to find the LUB. Ascend the tree from both `a`
  // and `b` in lockstep. The first type we see for a second time must be the
  // LUB because there are no cycles and the only way to encounter a type
  // twice is for it to be on the path above both `a` and `b`.
  std::unordered_set<HeapTypeInfo*> seen;
  seen.insert(infoA);
  seen.insert(infoB);
  while (true) {
    auto* nextA = infoA->supertype;
    auto* nextB = infoB->supertype;
    if (nextA == nullptr && nextB == nullptr) {
      // Did not find a LUB in the subtype tree.
      return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                                 getBasicHeapSupertype(b));
    }
    if (nextA) {
      if (!seen.insert(nextA).second) {
        return HeapType(uintptr_t(nextA));
      }
      infoA = nextA;
    }
    if (nextB) {
      if (!seen.insert(nextB).second) {
        return HeapType(uintptr_t(nextB));
      }
      infoB = nextB;
    }
  }
}